

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

int s3parse_comp_quest(pset_t *pset,uint32 n_pset,comp_quest_t *q,char *in_str)

{
  ushort **ppuVar1;
  quest_t **ppqVar2;
  uint32 *puVar3;
  char *pcVar4;
  long ln;
  byte bVar5;
  uint uVar6;
  byte *in_str_00;
  ulong uVar7;
  
  bVar5 = *in_str;
  if (bVar5 != 0) {
    ppuVar1 = __ctype_b_loc();
    in_str_00 = (byte *)(in_str + 1);
    do {
      if ((*(byte *)((long)*ppuVar1 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) {
        if (bVar5 == 0x28) {
          bVar5 = *in_str;
          pcVar4 = in_str;
          if (bVar5 == 0) goto LAB_0011f800;
          ppuVar1 = __ctype_b_loc();
          goto LAB_0011f7ec;
        }
        if (bVar5 != 0) {
          pcVar4 = "Composite question does not begin with \'(\' : %s\n";
          ln = 0x10e;
          goto LAB_0011f8e3;
        }
        break;
      }
      bVar5 = *in_str_00;
      in_str_00 = in_str_00 + 1;
    } while (bVar5 != 0);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
          ,0x107,"Empty string seen for composite question\n");
  return -1;
  while( true ) {
    bVar5 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    if (bVar5 == 0) break;
LAB_0011f7ec:
    if ((*(byte *)((long)*ppuVar1 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
  }
LAB_0011f800:
  uVar7 = 0;
  uVar6 = 0;
  if (pcVar4[1] != '\0') {
    uVar6 = 0;
    do {
      pcVar4 = strchr(pcVar4 + 1,0x28);
      if (pcVar4 == (char *)0x0) break;
      uVar6 = uVar6 + 1;
    } while (pcVar4[1] != '\0');
  }
  q->sum_len = uVar6;
  ppqVar2 = (quest_t **)
            __ckd_calloc__((ulong)uVar6,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                           ,0x114);
  q->conj_q = ppqVar2;
  puVar3 = (uint32 *)
           __ckd_calloc__((ulong)q->sum_len,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                          ,0x115);
  q->prod_len = puVar3;
  while( true ) {
    in_str_00 = (byte *)s3parse_conj(pset,n_pset,q->conj_q + uVar7,q->prod_len + uVar7,
                                     (char *)in_str_00);
    if (in_str_00 == (byte *)0x0) break;
    uVar7 = (ulong)((int)uVar7 + 1);
    if (*in_str_00 != 0x28) {
      return 0;
    }
  }
  pcVar4 = "Error while parsing %s\n";
  ln = 0x124;
LAB_0011f8e3:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
          ,ln,pcVar4,in_str);
  return -1;
}

Assistant:

int
s3parse_comp_quest(pset_t *pset,
		   uint32 n_pset,
		   comp_quest_t *q,
		   char *in_str)
{
    char *s;
    uint32 i;

    s = in_str;

    for (; *s != '\0' && isspace((unsigned char)*s); s++);

    if (*s == '\0') {
	E_ERROR("Empty string seen for composite question\n");

	return S3_ERROR;
    }

    if (*s != '(') {
	E_ERROR("Composite question does not begin with '(' : %s\n",
		in_str);
	
	return S3_ERROR;
    }
	
    q->sum_len  = s3cnt_q_term(in_str);
    q->conj_q   = (quest_t **)ckd_calloc(q->sum_len, sizeof(quest_t *));
    q->prod_len = (uint32 *)ckd_calloc(q->sum_len, sizeof(uint32));

    ++s;	/* skip the open paren */

    i = 0;
    do {
	s = s3parse_conj(pset,
			 n_pset,
			 &q->conj_q[i],
			 &q->prod_len[i],
			 s);
	++i;
    } while (s && *s && *s == '(');

    if (s == NULL) {
	E_ERROR("Error while parsing %s\n", in_str);

	return S3_ERROR;
    }

    return S3_SUCCESS;
}